

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

void call(ch_context *context,ch_function *function,ch_argcount argcount)

{
  uint uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  char *error;
  ch_exit exit;
  
  uVar1 = (context->call_stack).size;
  uVar2 = (ulong)uVar1;
  if (uVar2 < 0x100) {
    if (function->argcount != argcount) {
      ch_runtime_error(context,EXIT_NOT_ENOUGH_ARGS_IN_STACK,
                       "Incorrect number of arguments passed to function (expected %u, got %u).",
                       (ulong)function->argcount,(ulong)argcount);
      return;
    }
    puVar3 = context->pstart + context->data_size + (ulong)function->ptr;
    if ((context->pstart <= puVar3) && (puVar3 < context->pend)) {
      (context->call_stack).size = uVar1 + 1;
      (context->call_stack).calls[uVar2].return_addr = context->pcurrent;
      (context->call_stack).calls[uVar2].stack_addr = (int)(context->stack).size - (uint)argcount;
      (context->call_stack).calls[uVar2].closure = (ch_closure *)0x0;
      context->pcurrent = puVar3;
      return;
    }
    error = "Function pointer exceeds bounds of program.";
    exit = EXIT_INVALID_INSTRUCTION_POINTER;
  }
  else {
    error = "Stack limit reached.";
    exit = EXIT_STACK_SIZE_EXCEEDED;
  }
  ch_runtime_error(context,exit,error);
  return;
}

Assistant:

static void call(ch_context *context, ch_function *function,
                 ch_argcount argcount) {
  if (context->call_stack.size >= CH_CALL_STACK_SIZE) {
    ch_runtime_error(context, EXIT_STACK_SIZE_EXCEEDED, "Stack limit reached.");
    return;
  }

  if (argcount != function->argcount) {
    ch_runtime_error(
        context, EXIT_NOT_ENOUGH_ARGS_IN_STACK,
        "Incorrect number of arguments passed to function (expected %" PRIu8
        ", got %" PRIu8 ").",
        function->argcount, argcount);
    return;
  }

  uint8_t *function_ptr = context->pstart + function->ptr + context->data_size;
  if (!IS_PROGRAM_PTR_SAFE(context, function_ptr)) {
    ch_runtime_error(context, EXIT_INVALID_INSTRUCTION_POINTER,
                     "Function pointer exceeds bounds of program.");
    return;
  }

  ch_call *call = &context->call_stack.calls[context->call_stack.size++];
  call->return_addr = context->pcurrent;
  call->stack_addr = CH_STACK_ADDR(&context->stack) - function->argcount;
  call->closure = NULL;

  context->pcurrent = function_ptr;
}